

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O0

void cftf161(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double y15i;
  double y15r;
  double y14i;
  double y14r;
  double y13i;
  double y13r;
  double y12i;
  double y12r;
  double y11i;
  double y11r;
  double y10i;
  double y10r;
  double y9i;
  double y9r;
  double y8i;
  double y8r;
  double y7i;
  double y7r;
  double y6i;
  double y6r;
  double y5i;
  double y5r;
  double y4i;
  double y4r;
  double y3i;
  double y3r;
  double y2i;
  double y2r;
  double y1i;
  double y1r;
  double y0i;
  double y0r;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk1i;
  double wk1r;
  double wn4r;
  double *w_local;
  double *a_local;
  
  dVar36 = w[1];
  dVar34 = w[2];
  dVar35 = w[3];
  dVar1 = *a + a[0x10] + a[8] + a[0x18];
  dVar2 = a[1] + a[0x11] + a[9] + a[0x19];
  dVar3 = (*a + a[0x10]) - (a[8] + a[0x18]);
  dVar4 = (a[1] + a[0x11]) - (a[9] + a[0x19]);
  dVar5 = (*a - a[0x10]) - (a[9] - a[0x19]);
  dVar6 = (a[1] - a[0x11]) + (a[8] - a[0x18]);
  dVar7 = (*a - a[0x10]) + (a[9] - a[0x19]);
  dVar8 = (a[1] - a[0x11]) - (a[8] - a[0x18]);
  dVar9 = a[2] + a[0x12] + a[10] + a[0x1a];
  dVar10 = a[3] + a[0x13] + a[0xb] + a[0x1b];
  dVar11 = (a[2] + a[0x12]) - (a[10] + a[0x1a]);
  dVar12 = (a[3] + a[0x13]) - (a[0xb] + a[0x1b]);
  dVar13 = (a[2] - a[0x12]) - (a[0xb] - a[0x1b]);
  dVar14 = (a[3] - a[0x13]) + (a[10] - a[0x1a]);
  dVar15 = dVar34 * dVar13 + -(dVar35 * dVar14);
  dVar16 = dVar34 * dVar14 + dVar35 * dVar13;
  dVar13 = (a[2] - a[0x12]) + (a[0xb] - a[0x1b]);
  dVar14 = (a[3] - a[0x13]) - (a[10] - a[0x1a]);
  dVar17 = dVar35 * dVar13 + -(dVar34 * dVar14);
  dVar18 = dVar35 * dVar14 + dVar34 * dVar13;
  dVar13 = a[4] + a[0x14] + a[0xc] + a[0x1c];
  dVar14 = a[5] + a[0x15] + a[0xd] + a[0x1d];
  dVar19 = (a[4] + a[0x14]) - (a[0xc] + a[0x1c]);
  dVar20 = (a[5] + a[0x15]) - (a[0xd] + a[0x1d]);
  dVar21 = (a[4] - a[0x14]) - (a[0xd] - a[0x1d]);
  dVar22 = (a[5] - a[0x15]) + (a[0xc] - a[0x1c]);
  dVar23 = dVar36 * (dVar21 - dVar22);
  dVar21 = dVar36 * (dVar22 + dVar21);
  dVar22 = (a[4] - a[0x14]) + (a[0xd] - a[0x1d]);
  dVar24 = (a[5] - a[0x15]) - (a[0xc] - a[0x1c]);
  dVar25 = dVar36 * (dVar22 + dVar24);
  dVar22 = dVar36 * (dVar24 - dVar22);
  dVar24 = a[6] + a[0x16] + a[0xe] + a[0x1e];
  dVar26 = a[7] + a[0x17] + a[0xf] + a[0x1f];
  dVar27 = (a[6] + a[0x16]) - (a[0xe] + a[0x1e]);
  dVar28 = (a[7] + a[0x17]) - (a[0xf] + a[0x1f]);
  dVar29 = (a[6] - a[0x16]) - (a[0xf] - a[0x1f]);
  dVar30 = (a[7] - a[0x17]) + (a[0xe] - a[0x1e]);
  dVar31 = dVar35 * dVar29 + -(dVar34 * dVar30);
  dVar29 = dVar35 * dVar30 + dVar34 * dVar29;
  dVar30 = (a[6] - a[0x16]) + (a[0xf] - a[0x1f]);
  dVar32 = (a[7] - a[0x17]) - (a[0xe] - a[0x1e]);
  dVar33 = dVar34 * dVar30 + -(dVar35 * dVar32);
  dVar34 = dVar34 * dVar32 + dVar35 * dVar30;
  dVar35 = dVar7 - dVar25;
  dVar30 = dVar8 - dVar22;
  dVar7 = dVar7 + dVar25;
  dVar8 = dVar8 + dVar22;
  dVar22 = dVar17 - dVar33;
  dVar25 = dVar18 - dVar34;
  dVar17 = dVar17 + dVar33;
  dVar18 = dVar18 + dVar34;
  a[0x18] = dVar35 + dVar22;
  a[0x19] = dVar30 + dVar25;
  a[0x1a] = dVar35 - dVar22;
  a[0x1b] = dVar30 - dVar25;
  a[0x1c] = dVar7 - dVar18;
  a[0x1d] = dVar8 + dVar17;
  a[0x1e] = dVar7 + dVar18;
  a[0x1f] = dVar8 - dVar17;
  dVar34 = dVar5 + dVar23;
  dVar35 = dVar6 + dVar21;
  dVar5 = dVar5 - dVar23;
  dVar6 = dVar6 - dVar21;
  dVar21 = dVar15 + dVar31;
  dVar22 = dVar16 + dVar29;
  dVar15 = dVar15 - dVar31;
  dVar16 = dVar16 - dVar29;
  a[0x10] = dVar34 + dVar21;
  a[0x11] = dVar35 + dVar22;
  a[0x12] = dVar34 - dVar21;
  a[0x13] = dVar35 - dVar22;
  a[0x14] = dVar5 - dVar16;
  a[0x15] = dVar6 + dVar15;
  a[0x16] = dVar5 + dVar16;
  a[0x17] = dVar6 - dVar15;
  dVar34 = dVar11 - dVar28;
  dVar35 = dVar12 + dVar27;
  dVar21 = dVar36 * (dVar34 - dVar35);
  dVar34 = dVar36 * (dVar35 + dVar34);
  dVar11 = dVar11 + dVar28;
  dVar12 = dVar12 - dVar27;
  dVar35 = dVar36 * (dVar11 - dVar12);
  dVar36 = dVar36 * (dVar12 + dVar11);
  dVar22 = dVar3 - dVar20;
  dVar23 = dVar4 + dVar19;
  dVar3 = dVar3 + dVar20;
  dVar4 = dVar4 - dVar19;
  a[8] = dVar22 + dVar21;
  a[9] = dVar23 + dVar34;
  a[10] = dVar22 - dVar21;
  a[0xb] = dVar23 - dVar34;
  a[0xc] = dVar3 - dVar36;
  a[0xd] = dVar4 + dVar35;
  a[0xe] = dVar3 + dVar36;
  a[0xf] = dVar4 - dVar35;
  dVar36 = dVar1 + dVar13;
  dVar34 = dVar2 + dVar14;
  dVar1 = dVar1 - dVar13;
  dVar2 = dVar2 - dVar14;
  dVar35 = dVar9 + dVar24;
  dVar13 = dVar10 + dVar26;
  dVar9 = dVar9 - dVar24;
  dVar10 = dVar10 - dVar26;
  *a = dVar36 + dVar35;
  a[1] = dVar34 + dVar13;
  a[2] = dVar36 - dVar35;
  a[3] = dVar34 - dVar13;
  a[4] = dVar1 - dVar10;
  a[5] = dVar2 + dVar9;
  a[6] = dVar1 + dVar10;
  a[7] = dVar2 - dVar9;
  return;
}

Assistant:

void cftf161(FFTFLT *a, FFTFLT *w)
{
    FFTFLT wn4r, wk1r, wk1i,
        x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
        y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i,
        y8r, y8i, y9r, y9i, y10r, y10i, y11r, y11i,
        y12r, y12i, y13r, y13i, y14r, y14i, y15r, y15i;

    wn4r = w[1];
    wk1r = w[2];
    wk1i = w[3];
    x0r = a[0] + a[16];
    x0i = a[1] + a[17];
    x1r = a[0] - a[16];
    x1i = a[1] - a[17];
    x2r = a[8] + a[24];
    x2i = a[9] + a[25];
    x3r = a[8] - a[24];
    x3i = a[9] - a[25];
    y0r = x0r + x2r;
    y0i = x0i + x2i;
    y4r = x0r - x2r;
    y4i = x0i - x2i;
    y8r = x1r - x3i;
    y8i = x1i + x3r;
    y12r = x1r + x3i;
    y12i = x1i - x3r;
    x0r = a[2] + a[18];
    x0i = a[3] + a[19];
    x1r = a[2] - a[18];
    x1i = a[3] - a[19];
    x2r = a[10] + a[26];
    x2i = a[11] + a[27];
    x3r = a[10] - a[26];
    x3i = a[11] - a[27];
    y1r = x0r + x2r;
    y1i = x0i + x2i;
    y5r = x0r - x2r;
    y5i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y9r = wk1r * x0r - wk1i * x0i;
    y9i = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y13r = wk1i * x0r - wk1r * x0i;
    y13i = wk1i * x0i + wk1r * x0r;
    x0r = a[4] + a[20];
    x0i = a[5] + a[21];
    x1r = a[4] - a[20];
    x1i = a[5] - a[21];
    x2r = a[12] + a[28];
    x2i = a[13] + a[29];
    x3r = a[12] - a[28];
    x3i = a[13] - a[29];
    y2r = x0r + x2r;
    y2i = x0i + x2i;
    y6r = x0r - x2r;
    y6i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y10r = wn4r * (x0r - x0i);
    y10i = wn4r * (x0i + x0r);
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y14r = wn4r * (x0r + x0i);
    y14i = wn4r * (x0i - x0r);
    x0r = a[6] + a[22];
    x0i = a[7] + a[23];
    x1r = a[6] - a[22];
    x1i = a[7] - a[23];
    x2r = a[14] + a[30];
    x2i = a[15] + a[31];
    x3r = a[14] - a[30];
    x3i = a[15] - a[31];
    y3r = x0r + x2r;
    y3i = x0i + x2i;
    y7r = x0r - x2r;
    y7i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y11r = wk1i * x0r - wk1r * x0i;
    y11i = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y15r = wk1r * x0r - wk1i * x0i;
    y15i = wk1r * x0i + wk1i * x0r;
    x0r = y12r - y14r;
    x0i = y12i - y14i;
    x1r = y12r + y14r;
    x1i = y12i + y14i;
    x2r = y13r - y15r;
    x2i = y13i - y15i;
    x3r = y13r + y15r;
    x3i = y13i + y15i;
    a[24] = x0r + x2r;
    a[25] = x0i + x2i;
    a[26] = x0r - x2r;
    a[27] = x0i - x2i;
    a[28] = x1r - x3i;
    a[29] = x1i + x3r;
    a[30] = x1r + x3i;
    a[31] = x1i - x3r;
    x0r = y8r + y10r;
    x0i = y8i + y10i;
    x1r = y8r - y10r;
    x1i = y8i - y10i;
    x2r = y9r + y11r;
    x2i = y9i + y11i;
    x3r = y9r - y11r;
    x3i = y9i - y11i;
    a[16] = x0r + x2r;
    a[17] = x0i + x2i;
    a[18] = x0r - x2r;
    a[19] = x0i - x2i;
    a[20] = x1r - x3i;
    a[21] = x1i + x3r;
    a[22] = x1r + x3i;
    a[23] = x1i - x3r;
    x0r = y5r - y7i;
    x0i = y5i + y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    x0r = y5r + y7i;
    x0i = y5i - y7r;
    x3r = wn4r * (x0r - x0i);
    x3i = wn4r * (x0i + x0r);
    x0r = y4r - y6i;
    x0i = y4i + y6r;
    x1r = y4r + y6i;
    x1i = y4i - y6r;
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[10] = x0r - x2r;
    a[11] = x0i - x2i;
    a[12] = x1r - x3i;
    a[13] = x1i + x3r;
    a[14] = x1r + x3i;
    a[15] = x1i - x3r;
    x0r = y0r + y2r;
    x0i = y0i + y2i;
    x1r = y0r - y2r;
    x1i = y0i - y2i;
    x2r = y1r + y3r;
    x2i = y1i + y3i;
    x3r = y1r - y3r;
    x3i = y1i - y3i;
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[2] = x0r - x2r;
    a[3] = x0i - x2i;
    a[4] = x1r - x3i;
    a[5] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
}